

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

double __thiscall Tokenizer::readInteger(Tokenizer *this)

{
  int iVar1;
  byte bVar2;
  double dVar3;
  char c;
  string str;
  char local_49;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  bVar2 = 0;
  do {
    iVar1 = std::istream::peek();
    if ((bool)(iVar1 != 0x2e | bVar2)) {
      iVar1 = std::istream::peek();
      if (9 < iVar1 - 0x30U) {
        dVar3 = std::__cxx11::stod(&local_40,(size_t *)0x0);
        std::__cxx11::string::~string((string *)&local_40);
        return dVar3;
      }
    }
    std::istream::get((char *)this->inStream);
    bVar2 = bVar2 | local_49 == '.';
    std::__cxx11::string::push_back((char)&local_40);
  } while( true );
}

Assistant:

double Tokenizer::readInteger() {
    // This function is called when it is known that
    // the first character in input is a digit.
    // The function reads and returns all remaining digits.

    double doubleStr = 0;
    std::string str;
    char c;
    bool decimal = false;
    while( ((inStream.peek() == '.') && !decimal) || isdigit(inStream.peek())) {
        inStream.get(c);
        if(c == '.')
            decimal = true;
        str += c;
    }
    doubleStr = std::stod(str);
    return doubleStr;
}